

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TraceConfig_GuardrailOverrides::TraceConfig_GuardrailOverrides
          (TraceConfig_GuardrailOverrides *this)

{
  TraceConfig_GuardrailOverrides *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_GuardrailOverrides_009c19d0;
  this->max_upload_per_day_bytes_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<2UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

TraceConfig_GuardrailOverrides::TraceConfig_GuardrailOverrides() = default;